

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

ProcessorBase * __thiscall
soul::AST::Scope::findSingleMatchingProcessor(Scope *this,QualifiedIdentifier *name)

{
  ModuleBase *object;
  ProcessorBase *pPVar1;
  pool_ptr<soul::AST::ProcessorBase> p;
  pool_ptr<soul::AST::ProcessorBase> local_a8;
  CompileMessage local_a0;
  IdentifierPath local_68;
  
  object = findSingleMatchingSubModule(this,name);
  cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_a8,object);
  if (local_a8.object != (ProcessorBase *)0x0) {
    pPVar1 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_a8);
    return pPVar1;
  }
  QualifiedIdentifier::getPath(&local_68,name);
  Errors::notAProcessorOrGraph<soul::IdentifierPath>(&local_a0,&local_68);
  Context::throwError(&(name->super_Expression).super_Statement.super_ASTObject.context,&local_a0,
                      false);
}

Assistant:

ProcessorBase& findSingleMatchingProcessor (const QualifiedIdentifier& name) const
        {
            auto p = cast<ProcessorBase> (findSingleMatchingSubModule (name));

            if (p == nullptr)
                name.context.throwError (Errors::notAProcessorOrGraph (name.getPath()));

            return *p;
        }